

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O3

int main(void)

{
  FILE *__stream;
  uint errorCode;
  PaDeviceInfo *pPVar1;
  char *pcVar2;
  int iVar3;
  float fVar4;
  PaStream *stream;
  PaStreamParameters outputParameters;
  paTestData data;
  PaStream *local_260;
  PaStreamParameters local_258;
  PinkNoise local_238;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 local_28;
  
  local_238.pink_Index = 0;
  local_238.pink_IndexMask = 0xfff;
  local_238.pink_Scalar = 9.169946e-09;
  local_238.pink_Rows[0] = 0;
  local_238.pink_Rows[1] = 0;
  local_238.pink_Rows[2] = 0;
  local_238.pink_Rows[3] = 0;
  local_238.pink_Rows[4] = 0;
  local_238.pink_Rows[5] = 0;
  local_238.pink_Rows[6] = 0;
  local_238.pink_Rows[7] = 0;
  local_238.pink_Rows[8] = 0;
  local_238.pink_Rows[9] = 0;
  local_238.pink_Rows[10] = 0;
  local_238.pink_Rows[0xb] = 0;
  local_238.pink_RunningSum = 0;
  local_38 = 0xffff00000000;
  local_30 = 0x31f0f0f1;
  local_130 = 0;
  uStack_128 = 0;
  local_120 = 0;
  uStack_118 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  uStack_d8 = 0;
  local_d0 = 0;
  uStack_c8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_40 = 0;
  iVar3 = 0x14;
  do {
    fVar4 = GeneratePinkNoise(&local_238);
    printf("Pink = %f\n",SUB84((double)fVar4,0));
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_28 = 0x285ff0;
  errorCode = Pa_Initialize();
  if (errorCode == 0) {
    local_258.device = Pa_GetDefaultOutputDevice();
    if (local_258.device == -1) {
      main_cold_1();
      errorCode = 0;
    }
    else {
      local_258.channelCount = 2;
      local_258.hostApiSpecificStreamInfo = (void *)0x0;
      local_258.sampleFormat = 1;
      pPVar1 = Pa_GetDeviceInfo(local_258.device);
      local_258.suggestedLatency = pPVar1->defaultLowOutputLatency;
      errorCode = Pa_OpenStream(&local_260,(PaStreamParameters *)0x0,&local_258,44100.0,0x800,1,
                                patestCallback,&local_238);
      if ((errorCode == 0) && (errorCode = Pa_StartStream(local_260), errorCode == 0)) {
        puts("Stereo pink noise for one minute...");
        while (errorCode = Pa_IsStreamActive(local_260), errorCode == 1) {
          Pa_Sleep(100);
        }
        if ((-1 < (int)errorCode) && (errorCode = Pa_CloseStream(local_260), errorCode == 0)) {
          printf("Pink min = %f, max = %f\n",SUB84((double)pinkMin,0),(double)pinkMax);
          Pa_Terminate();
          return 0;
        }
      }
    }
  }
  Pa_Terminate();
  fwrite("An error occured while using the portaudio stream\n",0x32,1,_stderr);
  fprintf(_stderr,"Error number: %d\n",(ulong)errorCode);
  __stream = _stderr;
  pcVar2 = Pa_GetErrorText(errorCode);
  fprintf(__stream,"Error message: %s\n",pcVar2);
  return 0;
}

Assistant:

int main(void)
{
    PaStream*           stream;
    PaError             err;
    paTestData          data;
    PaStreamParameters  outputParameters;
    int                 totalSamps;
    static const double SR  = 44100.0;
    static const int    FPB = 2048; /* Frames per buffer: 46 ms buffers. */
    
    /* Initialize two pink noise signals with different numbers of rows. */
    InitializePinkNoise( &data.leftPink,  12 );
    InitializePinkNoise( &data.rightPink, 16 );

    /* Look at a few values. */
    {
        int i;
        float pink;
        for( i=0; i<20; i++ )
        {
            pink = GeneratePinkNoise( &data.leftPink );
            printf("Pink = %f\n", pink );
        }
    }

    data.sampsToGo = totalSamps = (int)(60.0 * SR);   /* Play a whole minute. */
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    /* Open a stereo PortAudio stream so we can hear the result. */
    outputParameters.device = Pa_GetDefaultOutputDevice(); /* Take the default output device. */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;                     /* Stereo output, most likely supported. */
    outputParameters.hostApiSpecificStreamInfo = NULL;
    outputParameters.sampleFormat = paFloat32;             /* 32 bit floating point output. */
    outputParameters.suggestedLatency =
                     Pa_GetDeviceInfo(outputParameters.device)->defaultLowOutputLatency;
    err = Pa_OpenStream(&stream,
                        NULL,                              /* No input. */
                        &outputParameters,
                        SR,                                /* Sample rate. */
                        FPB,                               /* Frames per buffer. */
                        paClipOff, /* we won't output out of range samples so don't bother clipping them */
                        patestCallback,
                        &data);
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;

    printf("Stereo pink noise for one minute...\n");

    while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) Pa_Sleep(100);
    if( err < 0 ) goto error;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;
#ifdef PINK_MEASURE
    printf("Pink min = %f, max = %f\n", pinkMin, pinkMax );
#endif
    Pa_Terminate();
    return 0;
error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return 0;
}